

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexToNFA.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
NFA::getClosure(vector<int,_std::allocator<int>_> *__return_storage_ptr__,NFA *this,int indx)

{
  int iVar1;
  pointer piVar2;
  vector<int,std::allocator<int>> *pvVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  pointer piVar6;
  int it;
  set<int,_std::less<int>,_std::allocator<int>_> ret;
  queue<int,_std::deque<int,_std::allocator<int>_>_> que;
  int local_c0;
  int local_bc;
  vector<int,std::allocator<int>> *local_b8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_b0;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_bc = indx;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
  local_b8 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  std::deque<int,_std::allocator<int>_>::push_back
            ((deque<int,_std::allocator<int>_> *)&local_80,&local_bc);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&local_b0,
             &local_bc);
  while (pvVar3 = local_b8,
        local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    iVar1 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)&local_80);
    local_c0 = CONCAT31(local_c0._1_3_,0x2d);
    pmVar4 = std::
             map<char,_std::vector<int,_std::allocator<int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&(this->StatusStore).super__Vector_base<Status,_std::allocator<Status>_>.
                           _M_impl.super__Vector_impl_data._M_start[iVar1].Next,
                          (key_type *)&local_c0);
    piVar2 = (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    for (piVar6 = (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start; piVar6 != piVar2; piVar6 = piVar6 + 1) {
      local_c0 = *piVar6;
      sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_b0,&local_c0);
      if (sVar5 == 0) {
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)&local_80,&local_c0);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_b0,&local_c0);
      }
    }
  }
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            (local_b8,(_Rb_tree_const_iterator<int>)
                      local_b0._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<int>)&local_b0._M_impl.super__Rb_tree_header,
             (allocator_type *)&local_c0);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_b0);
  return (vector<int,_std::allocator<int>_> *)pvVar3;
}

Assistant:

vector<int> getClosure(int indx){
        set<int>ret;
        queue<int>que;
        que.push(indx);
        ret.insert(indx);
        while (!que.empty()){
            int c = que.front();
            que.pop();
            for(auto it:(StatusStore[c].Next[EPSILON])){
                if(!ret.count(it)){
                    que.push(it);
                    ret.insert(it);
                }
            }
        }
        return vector<int>(ret.begin(),ret.end());
    }